

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

DecodePsbtRequestStruct * __thiscall
cfd::api::json::DecodePsbtRequest::ConvertToStruct(DecodePsbtRequest *this)

{
  DecodePsbtRequestStruct *in_RSI;
  DecodePsbtRequestStruct *in_RDI;
  DecodePsbtRequestStruct *result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  DecodePsbtRequestStruct *this_00;
  
  this_00 = in_RDI;
  DecodePsbtRequestStruct::DecodePsbtRequestStruct(in_RSI);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&in_RSI->field_0x38);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->network,
             (string *)
             &(in_RSI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  in_RDI->has_detail = (bool)((byte)in_RSI[1].psbt & 1);
  in_RDI->has_simple = (bool)(in_RSI[1].field_0x1 & 1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,in_stack_ffffffffffffffb8);
  return this_00;
}

Assistant:

DecodePsbtRequestStruct DecodePsbtRequest::ConvertToStruct() const {  // NOLINT
  DecodePsbtRequestStruct result;
  result.psbt = psbt_;
  result.network = network_;
  result.has_detail = has_detail_;
  result.has_simple = has_simple_;
  result.ignore_items = ignore_items;
  return result;
}